

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

uint __thiscall
capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage::allocateFromHole
          (DataLocationUsage *this,Group *group,DataLocation *location,uint lgSize)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  byte bVar15;
  ulong uVar16;
  int iVar18;
  undefined1 auVar17 [16];
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar30;
  int iVar35;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int iVar36;
  int iVar38;
  undefined1 auVar37 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar41 [16];
  uchar local_2a;
  byte local_29;
  
  auVar9 = _DAT_0057c280;
  auVar8 = _DAT_0057c270;
  auVar7 = _DAT_0057c260;
  auVar6 = _DAT_00501130;
  auVar5 = _DAT_00501120;
  bVar15 = (byte)lgSize;
  if (this->isUsed == false) {
    this->isUsed = true;
    this->lgSizeUsed = bVar15;
    uVar11 = 0;
  }
  else {
    bVar1 = this->lgSizeUsed;
    uVar16 = (ulong)bVar1;
    if (lgSize < bVar1) {
      HoleSet<unsigned_char>::tryAllocate((HoleSet<unsigned_char> *)&local_2a,(uchar)&this->holes);
      if (local_2a == '\x01') {
        uVar11 = (uint)local_29;
      }
      else {
        bVar1 = this->lgSizeUsed;
        uVar11 = 1 << (bVar1 - bVar15 & 0x1f);
        if (bVar15 < bVar1) {
          uVar10 = uVar11 + 1;
          uVar16 = (ulong)lgSize;
          do {
            (this->holes).holes[uVar16] = (uchar)uVar10;
            uVar16 = uVar16 + 1;
            uVar10 = (uVar10 & 0xff) + 1 >> 1;
          } while (bVar1 != uVar16);
        }
        this->lgSizeUsed = bVar1 + 1;
      }
    }
    else {
      if (bVar1 < bVar15) {
        uVar12 = (ulong)(lgSize & 7);
        if ((ulong)(lgSize & 7) < uVar16 + 1) {
          uVar12 = uVar16 + 1;
        }
        lVar13 = (uVar12 - uVar16) + -1;
        auVar17._8_4_ = (int)lVar13;
        auVar17._0_8_ = lVar13;
        auVar17._12_4_ = (int)((ulong)lVar13 >> 0x20);
        uVar14 = 0;
        auVar17 = auVar17 ^ _DAT_00501130;
        do {
          auVar29._8_4_ = (int)uVar14;
          auVar29._0_8_ = uVar14;
          auVar29._12_4_ = (int)(uVar14 >> 0x20);
          auVar21 = (auVar29 | auVar5) ^ auVar6;
          iVar30 = auVar17._0_4_;
          iVar36 = -(uint)(iVar30 < auVar21._0_4_);
          iVar18 = auVar17._4_4_;
          auVar22._4_4_ = -(uint)(iVar18 < auVar21._4_4_);
          iVar35 = auVar17._8_4_;
          iVar38 = -(uint)(iVar35 < auVar21._8_4_);
          iVar19 = auVar17._12_4_;
          auVar22._12_4_ = -(uint)(iVar19 < auVar21._12_4_);
          auVar32._4_4_ = iVar36;
          auVar32._0_4_ = iVar36;
          auVar32._8_4_ = iVar38;
          auVar32._12_4_ = iVar38;
          auVar39 = pshuflw(in_XMM11,auVar32,0xe8);
          auVar24._4_4_ = -(uint)(auVar21._4_4_ == iVar18);
          auVar24._12_4_ = -(uint)(auVar21._12_4_ == iVar19);
          auVar24._0_4_ = auVar24._4_4_;
          auVar24._8_4_ = auVar24._12_4_;
          auVar41 = pshuflw(in_XMM12,auVar24,0xe8);
          auVar22._0_4_ = auVar22._4_4_;
          auVar22._8_4_ = auVar22._12_4_;
          auVar40 = pshuflw(auVar39,auVar22,0xe8);
          auVar21._8_4_ = 0xffffffff;
          auVar21._0_8_ = 0xffffffffffffffff;
          auVar21._12_4_ = 0xffffffff;
          auVar21 = (auVar40 | auVar41 & auVar39) ^ auVar21;
          auVar21 = packssdw(auVar21,auVar21);
          if ((auVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            (this->holes).holes[uVar14 + uVar16] = '\x01';
          }
          auVar22 = auVar24 & auVar32 | auVar22;
          auVar21 = packssdw(auVar22,auVar22);
          auVar40._8_4_ = 0xffffffff;
          auVar40._0_8_ = 0xffffffffffffffff;
          auVar40._12_4_ = 0xffffffff;
          auVar21 = packssdw(auVar21 ^ auVar40,auVar21 ^ auVar40);
          if ((auVar21._0_4_ >> 0x10 & 1) != 0) {
            (this->holes).holes[uVar14 + uVar16 + 1] = '\x01';
          }
          auVar21 = (auVar29 | auVar9) ^ auVar6;
          iVar36 = -(uint)(iVar30 < auVar21._0_4_);
          auVar37._4_4_ = -(uint)(iVar18 < auVar21._4_4_);
          iVar38 = -(uint)(iVar35 < auVar21._8_4_);
          auVar37._12_4_ = -(uint)(iVar19 < auVar21._12_4_);
          auVar23._4_4_ = iVar36;
          auVar23._0_4_ = iVar36;
          auVar23._8_4_ = iVar38;
          auVar23._12_4_ = iVar38;
          auVar31._4_4_ = -(uint)(auVar21._4_4_ == iVar18);
          auVar31._12_4_ = -(uint)(auVar21._12_4_ == iVar19);
          auVar31._0_4_ = auVar31._4_4_;
          auVar31._8_4_ = auVar31._12_4_;
          auVar37._0_4_ = auVar37._4_4_;
          auVar37._8_4_ = auVar37._12_4_;
          auVar21 = auVar31 & auVar23 | auVar37;
          auVar21 = packssdw(auVar21,auVar21);
          auVar2._8_4_ = 0xffffffff;
          auVar2._0_8_ = 0xffffffffffffffff;
          auVar2._12_4_ = 0xffffffff;
          auVar21 = packssdw(auVar21 ^ auVar2,auVar21 ^ auVar2);
          if ((auVar21 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            (this->holes).holes[uVar14 + uVar16 + 2] = '\x01';
          }
          auVar24 = pshufhw(auVar23,auVar23,0x84);
          auVar32 = pshufhw(auVar31,auVar31,0x84);
          auVar22 = pshufhw(auVar24,auVar37,0x84);
          auVar25._8_4_ = 0xffffffff;
          auVar25._0_8_ = 0xffffffffffffffff;
          auVar25._12_4_ = 0xffffffff;
          auVar25 = (auVar22 | auVar32 & auVar24) ^ auVar25;
          auVar24 = packssdw(auVar25,auVar25);
          if ((auVar24 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            (this->holes).holes[uVar14 + uVar16 + 3] = '\x01';
          }
          auVar24 = (auVar29 | auVar8) ^ auVar6;
          iVar36 = -(uint)(iVar30 < auVar24._0_4_);
          auVar27._4_4_ = -(uint)(iVar18 < auVar24._4_4_);
          iVar38 = -(uint)(iVar35 < auVar24._8_4_);
          auVar27._12_4_ = -(uint)(iVar19 < auVar24._12_4_);
          auVar33._4_4_ = iVar36;
          auVar33._0_4_ = iVar36;
          auVar33._8_4_ = iVar38;
          auVar33._12_4_ = iVar38;
          auVar21 = pshuflw(auVar21,auVar33,0xe8);
          auVar26._4_4_ = -(uint)(auVar24._4_4_ == iVar18);
          auVar26._12_4_ = -(uint)(auVar24._12_4_ == iVar19);
          auVar26._0_4_ = auVar26._4_4_;
          auVar26._8_4_ = auVar26._12_4_;
          auVar24 = pshuflw(auVar41 & auVar39,auVar26,0xe8);
          in_XMM12 = auVar24 & auVar21;
          auVar27._0_4_ = auVar27._4_4_;
          auVar27._8_4_ = auVar27._12_4_;
          auVar21 = pshuflw(auVar21,auVar27,0xe8);
          auVar39._8_4_ = 0xffffffff;
          auVar39._0_8_ = 0xffffffffffffffff;
          auVar39._12_4_ = 0xffffffff;
          auVar39 = (auVar21 | in_XMM12) ^ auVar39;
          in_XMM11 = packssdw(auVar39,auVar39);
          if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            (this->holes).holes[uVar14 + uVar16 + 4] = '\x01';
          }
          auVar27 = auVar26 & auVar33 | auVar27;
          auVar21 = packssdw(auVar27,auVar27);
          auVar41._8_4_ = 0xffffffff;
          auVar41._0_8_ = 0xffffffffffffffff;
          auVar41._12_4_ = 0xffffffff;
          auVar21 = packssdw(auVar21 ^ auVar41,auVar21 ^ auVar41);
          if ((auVar21 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            (this->holes).holes[uVar14 + uVar16 + 5] = '\x01';
          }
          auVar21 = (auVar29 | auVar7) ^ auVar6;
          iVar30 = -(uint)(iVar30 < auVar21._0_4_);
          auVar34._4_4_ = -(uint)(iVar18 < auVar21._4_4_);
          iVar35 = -(uint)(iVar35 < auVar21._8_4_);
          auVar34._12_4_ = -(uint)(iVar19 < auVar21._12_4_);
          auVar28._4_4_ = iVar30;
          auVar28._0_4_ = iVar30;
          auVar28._8_4_ = iVar35;
          auVar28._12_4_ = iVar35;
          auVar20._4_4_ = -(uint)(auVar21._4_4_ == iVar18);
          auVar20._12_4_ = -(uint)(auVar21._12_4_ == iVar19);
          auVar20._0_4_ = auVar20._4_4_;
          auVar20._8_4_ = auVar20._12_4_;
          auVar34._0_4_ = auVar34._4_4_;
          auVar34._8_4_ = auVar34._12_4_;
          auVar21 = auVar20 & auVar28 | auVar34;
          auVar21 = packssdw(auVar21,auVar21);
          auVar3._8_4_ = 0xffffffff;
          auVar3._0_8_ = 0xffffffffffffffff;
          auVar3._12_4_ = 0xffffffff;
          auVar21 = packssdw(auVar21 ^ auVar3,auVar21 ^ auVar3);
          if ((auVar21 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            this[1].holes.holes[uVar14 + uVar16 + -2] = '\x01';
          }
          auVar29 = pshufhw(auVar28,auVar28,0x84);
          auVar21 = pshufhw(auVar20,auVar20,0x84);
          auVar24 = pshufhw(auVar29,auVar34,0x84);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar21 = packssdw(auVar21 & auVar29,(auVar24 | auVar21 & auVar29) ^ auVar4);
          if ((auVar21 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            this[1].holes.holes[uVar14 + uVar16 + -1] = '\x01';
          }
          uVar14 = uVar14 + 8;
        } while (((uVar12 - uVar16) + 7 & 0xfffffffffffffff8) != uVar14);
      }
      this->lgSizeUsed = bVar15 + 1;
      uVar11 = 1;
    }
  }
  return (location->offset << ((char)location->lgSize - bVar15 & 0x1f)) + uVar11;
}

Assistant:

uint allocateFromHole(Group& group, Union::DataLocation& location, uint lgSize) {
        // Allocate the given space from an existing hole, given smallestHoleAtLeast() already
        // returned non-null indicating such a hole exists.

        uint result;

        if (!isUsed) {
          // The location is totally unused, so just allocate from the beginning.
          KJ_DASSERT(lgSize <= location.lgSize, "Did smallestHoleAtLeast() really find a hole?");
          result = 0;
          isUsed = true;
          lgSizeUsed = lgSize;
        } else if (lgSize >= lgSizeUsed) {
          // Requested size is at least our current usage, so clearly won't fit in any holes.
          // We must expand to double the requested size, and return the second half.
          KJ_DASSERT(lgSize < location.lgSize, "Did smallestHoleAtLeast() really find a hole?");
          holes.addHolesAtEnd(lgSizeUsed, 1, lgSize);
          lgSizeUsed = lgSize + 1;
          result = 1;
        } else KJ_IF_SOME(hole, holes.tryAllocate(lgSize)) {
          // Found a hole.
          result = hole;
        } else {
          // The requested size is smaller than what we're using so far, but didn't fit in a
          // hole.  We should double our "used" size, then allocate from the new space.
          KJ_DASSERT(lgSizeUsed < location.lgSize,
                     "Did smallestHoleAtLeast() really find a hole?");
          result = 1 << (lgSizeUsed - lgSize);
          holes.addHolesAtEnd(lgSize, result + 1, lgSizeUsed);
          lgSizeUsed += 1;
        }